

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyBoundaryIndicesAreSorted.hpp
# Opt level: O1

void njoy::ENDFtk::record::InterpolationBase::verifyBoundaryIndicesAreSorted
               (vector<long,_std::allocator<long>_> *boundaryIndices)

{
  long *plVar1;
  long *plVar2;
  undefined8 *puVar3;
  long lVar4;
  long *plVar5;
  
  plVar1 = (boundaryIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  plVar2 = (boundaryIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  plVar5 = plVar2;
  if (plVar1 != plVar2) {
    do {
      plVar5 = plVar1 + 1;
      if (plVar5 == plVar2) break;
      lVar4 = *plVar1;
      plVar1 = plVar5;
    } while (lVar4 <= *plVar5);
  }
  if (plVar5 != plVar2) {
    tools::Log::error<char_const*>("Interpolation boundary indices are not sorted");
    lVar4 = (long)plVar5 -
            (long)(boundaryIndices->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    tools::Log::info<char_const*,long,long>("Boundary index [{}]: {}",lVar4 + -1,plVar5[-1]);
    tools::Log::info<char_const*,long,long>("Boundary index [{}]: {}",lVar4,*plVar5);
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = getenv;
    __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
  }
  return;
}

Assistant:

static void
verifyBoundaryIndicesAreSorted( const std::vector< long >& boundaryIndices ){
  auto boundaryIndexIterator = 
    std::is_sorted_until( boundaryIndices.begin(), boundaryIndices.end() );

  const bool boundariesAreSorted =
    ( boundaryIndexIterator == boundaryIndices.end() );
 
  if ( not boundariesAreSorted ){
    Log::error( "Interpolation boundary indices are not sorted" );
    const auto position = boundaryIndexIterator - boundaryIndices.begin();
    Log::info( "Boundary index [{}]: {}",
               (position - 1), boundaryIndexIterator[-1] );
    Log::info( "Boundary index [{}]: {}", position, boundaryIndexIterator[0] );
    throw std::exception();
  }
}